

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_17::NameGenerator::GenerateName
          (NameGenerator *this,char *prefix,Index index,uint disambiguator,string *str)

{
  Index extraout_EDX;
  Index extraout_EDX_00;
  Index index_00;
  string sStack_68;
  string local_48;
  
  std::__cxx11::string::assign((char *)str);
  std::__cxx11::string::append((char *)str);
  if (index != 0xffffffff) {
    if ((this->opts_ & AlphaNames) == None) {
      std::__cxx11::to_string(&sStack_68,index);
    }
    else {
      if (((*prefix == 'l') || (*prefix == 'p')) && (prefix[1] == '\0')) {
        std::__cxx11::string::pop_back();
        index_00 = extraout_EDX_00;
      }
      else {
        std::__cxx11::string::push_back((char)str);
        index_00 = extraout_EDX;
      }
      IndexToAlphaName_abi_cxx11_(&sStack_68,(wabt *)(ulong)index,index_00);
    }
    std::__cxx11::string::append((string *)str);
    std::__cxx11::string::_M_dispose();
  }
  if (disambiguator != 0) {
    std::__cxx11::to_string(&local_48,disambiguator);
    std::operator+(&sStack_68,'_',&local_48);
    std::__cxx11::string::append((string *)str);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void NameGenerator::GenerateName(const char* prefix,
                                 Index index,
                                 unsigned disambiguator,
                                 std::string* str) {
  *str = "$";
  *str += prefix;
  if (index != kInvalidIndex) {
    if (opts_ & NameOpts::AlphaNames) {
      // For params and locals, do not use a prefix char.
      if (!strcmp(prefix, "p") || !strcmp(prefix, "l")) {
        str->pop_back();
      } else {
        *str += '_';
      }
      *str += IndexToAlphaName(index);
    } else {
      *str += std::to_string(index);
    }
  }
  if (disambiguator != 0) {
    *str += '_' + std::to_string(disambiguator);
  }
}